

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtCompoundShape * __thiscall
cbtCollisionWorldImporter::createCompoundShape(cbtCollisionWorldImporter *this)

{
  cbtCompoundShape *this_00;
  cbtCompoundShape *local_18;
  
  this_00 = (cbtCompoundShape *)cbtCompoundShape::operator_new(0x80);
  cbtCompoundShape::cbtCompoundShape(this_00,true,0);
  local_18 = this_00;
  cbtAlignedObjectArray<cbtCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(cbtCollisionShape **)&local_18);
  return this_00;
}

Assistant:

cbtCompoundShape* cbtCollisionWorldImporter::createCompoundShape()
{
	cbtCompoundShape* shape = new cbtCompoundShape();
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}